

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          GLenum shaderType)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar2;
  char *pcVar3;
  ostream *poVar4;
  GLenum glShaderType;
  char *local_1e8;
  ostringstream local_1a8 [8];
  ostringstream source;
  GLSLVersion version;
  bool isES32;
  GLenum shaderType_local;
  NegativeTestContext *ctx_local;
  
  glShaderType = (GLenum)ctx;
  pRVar2 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar3 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)local_1a8,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  if (bVar1) {
    local_1e8 = "";
  }
  else {
    local_1e8 = anon_unknown_4::getShaderExtensionDeclaration(glShaderType);
  }
  std::operator<<(poVar4,local_1e8);
  if (glShaderType == 0x8e87) {
    poVar4 = std::operator<<((ostream *)local_1a8,"layout(triangles, equal_spacing, cw) in;\n");
    std::operator<<(poVar4,"void main() {}\n");
  }
  else if (glShaderType == 0x8e88) {
    poVar4 = std::operator<<((ostream *)local_1a8,"layout(vertices = 3) out;\n");
    std::operator<<(poVar4,"void main() {}\n");
  }
  else {
    std::operator<<((ostream *)local_1a8,"void main() {}\n");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string genCommonSource (NegativeTestContext& ctx, glw::GLenum shaderType)
{
	const bool				isES32		= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version		= isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	std::ostringstream		source;

	source << glu::getGLSLVersionDeclaration(version) << "\n"
		   << ((isES32) ? "" : getShaderExtensionDeclaration(shaderType));

	switch (shaderType)
	{
		case GL_TESS_CONTROL_SHADER:
			source	<< "layout(vertices = 3) out;\n"
					<< "void main() {}\n";
			break;

		case GL_TESS_EVALUATION_SHADER:
			source	<< "layout(triangles, equal_spacing, cw) in;\n"
					<< "void main() {}\n";
			break;

		default:
			source  << "void main() {}\n";
			break;
	}

	return source.str();
}